

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void act_area(char *format,CHAR_DATA *ch,CHAR_DATA *victim)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  CHAR_DATA *pCVar5;
  ROOM_INDEX_DATA *pRVar6;
  bool bVar7;
  char *pcVar8;
  char cVar9;
  char *pcVar10;
  DESCRIPTOR_DATA **ppDVar11;
  char *pcVar12;
  string_view fmt;
  size_t sStack_2460;
  char buf2 [4608];
  char buf [4608];
  
  if ((format != (char *)0x0) && (*format != '\0')) {
    ppDVar11 = &descriptor_list;
LAB_002d862f:
    while (ppDVar11 = &((DESCRIPTOR_DATA *)ppDVar11)->next->next,
          (DESCRIPTOR_DATA *)ppDVar11 != (DESCRIPTOR_DATA *)0x0) {
      if (((((((DESCRIPTOR_DATA *)ppDVar11)->connected == 0) &&
            (pCVar5 = ((DESCRIPTOR_DATA *)ppDVar11)->character, pCVar5 != (CHAR_DATA *)0x0)) &&
           (pRVar6 = pCVar5->in_room, pRVar6 != (ROOM_INDEX_DATA *)0x0)) &&
          ((pRVar6->area == ch->in_room->area && ((pCVar5->comm[0] & 1) == 0)))) &&
         (((pRVar6->room_flags[0] & 0x200000) == 0 && (bVar7 = is_awake(pCVar5), bVar7)))) {
        pCVar5 = ((DESCRIPTOR_DATA *)ppDVar11)->character;
        bVar7 = is_npc(pCVar5);
        if ((bVar7) || (pCVar5->desc != (DESCRIPTOR_DATA *)0x0)) {
          pcVar10 = buf;
          pcVar12 = format;
          do {
            for (; cVar1 = *pcVar12, cVar1 == '$'; pcVar12 = pcVar12 + 2) {
              cVar1 = pcVar12[1];
              if ((byte)(cVar1 + 0xbfU) < 0x1a) {
                sStack_2460 = 0x1e;
                pcVar8 = "Act: missing arg2 for code {}.";
LAB_002d86f1:
                fmt._M_str = pcVar8;
                fmt._M_len = sStack_2460;
                CLogger::Warn<char_const&>((CLogger *)&RS.field_0x140,fmt,pcVar12 + 1);
                pcVar8 = " <@@@> ";
              }
              else if (cVar1 == 'e') {
                uVar4 = victim->sex;
                if (1 < (short)uVar4) {
                  uVar4 = 2;
                }
                if ((short)uVar4 < 1) {
                  uVar4 = 0;
                }
                pcVar8 = act_area::he_she[uVar4];
              }
              else if (cVar1 == 'm') {
                uVar2 = victim->sex;
                if (1 < (short)uVar2) {
                  uVar2 = 2;
                }
                if ((short)uVar2 < 1) {
                  uVar2 = 0;
                }
                pcVar8 = act_area::him_her[uVar2];
              }
              else if (cVar1 == 's') {
                uVar3 = victim->sex;
                if (1 < (short)uVar3) {
                  uVar3 = 2;
                }
                if ((short)uVar3 < 1) {
                  uVar3 = 0;
                }
                pcVar8 = act_area::his_her[uVar3];
              }
              else {
                if (cVar1 != 'n') {
                  sStack_2460 = 0x11;
                  pcVar8 = "Act: bad code {}.";
                  goto LAB_002d86f1;
                }
                pcVar8 = get_descr_form(victim,ch,false);
              }
              for (; cVar1 = *pcVar8, *pcVar10 = cVar1, cVar1 != '\0'; pcVar8 = pcVar8 + 1) {
                pcVar10 = pcVar10 + 1;
              }
            }
            if (cVar1 == '\0') goto LAB_002d87ec;
            pcVar12 = pcVar12 + 1;
            *pcVar10 = cVar1;
            pcVar10 = pcVar10 + 1;
          } while( true );
        }
      }
    }
  }
  return;
LAB_002d87ec:
  *pcVar10 = '\0';
  if (pCVar5->desc != (DESCRIPTOR_DATA *)0x0) {
    pcVar12 = ch->short_descr;
    pcVar8 = get_char_color(pCVar5,"yells");
    sprintf(buf2,"%s yells \'%s",pcVar12,pcVar8);
    cVar1 = (char)buf2._0_4_;
    cVar9 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar9 = cVar1;
    }
    buf2[0] = cVar9;
    send_to_char(buf2,pCVar5);
    write_to_buffer(pCVar5->desc,buf,(int)pcVar10 - (int)buf);
    pcVar10 = END_COLOR(pCVar5);
    sprintf(buf2,"%s\'\n\r",pcVar10);
    send_to_char(buf2,pCVar5);
  }
  goto LAB_002d862f;
}

Assistant:

void act_area(const char *format, CHAR_DATA *ch, CHAR_DATA *victim)
{
	static char *const he_she[] = {"it", "he", "she"};
	static char *const him_her[] = {"it", "him", "her"};
	static char *const his_her[] = {"its", "his", "her"};
	char buf[MAX_STRING_LENGTH], buf2[MSL];
	CHAR_DATA *to;
	const char *str;
	const char *i;
	char *point;
	DESCRIPTOR_DATA *d;

	/*
	 * Discard null and zero-length messages.
	 */
	if (format == nullptr || format[0] == '\0')
		return;

	/*colorconv(format, format, ch);*/
	for (d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character
			&& d->character->in_room != nullptr
			&& d->character->in_room->area == ch->in_room->area
			&& !IS_SET(d->character->comm, COMM_QUIET))
		{
			if (IS_SET(d->character->in_room->room_flags, ROOM_SILENCE))
				continue;

			if (!is_awake(d->character))
				continue;

			to = d->character;

			if ((!is_npc(to) && to->desc == nullptr))
				continue;

			point = buf;
			str = format;

			while (*str != '\0')
			{
				if (*str != '$')
				{
					*point++ = *str++;
					continue;
				}

				++str;

				if (*str >= 'A' && *str <= 'Z')
				{
					RS.Logger.Warn("Act: missing arg2 for code {}.", *str);
					i = " <@@@> ";
				}
				else
				{
					switch (*str)
					{
						/* Thx alex for 't' idea */
						case 'n':
							i = get_descr_form(victim, ch, false);
							break;
						case 'e':
							i = he_she[URANGE(0, victim->sex, 2)];
							break;
						case 'm':
							i = him_her[URANGE(0, victim->sex, 2)];
							break;
						case 's':
							i = his_her[URANGE(0, victim->sex, 2)];
							break;
						default:
							RS.Logger.Warn("Act: bad code {}.", *str);
							i = " <@@@> ";
							break;
					}
				}

				++str;

				while ((*point = *i) != '\0')
				{
					++point, ++i;
				}
			}

			*point = '\0';

			if (to->desc != nullptr)
			{
				sprintf(buf2, "%s yells '%s", ch->short_descr, get_char_color(to, "yells"));
				buf2[0] = UPPER(buf2[0]);
				send_to_char(buf2, to);

				write_to_buffer(to->desc, buf, point - buf);

				sprintf(buf2, "%s'\n\r", END_COLOR(to));
				send_to_char(buf2, to);
			}
		}
	}
}